

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenproblem_solvers.cpp
# Opt level: O0

Vector<float>
geometrycentral::largestEigenvector<float>
          (SparseMatrix<float> *energyMatrix,SparseMatrix<float> *massMatrix,size_t nIterations)

{
  Vector<float> *in_RCX;
  SparseMatrix<float,_0,_int> *in_RDX;
  Index extraout_RDX;
  Vector<float> *in_RDI;
  Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> PVar1;
  Vector<float> VVar2;
  size_t iIter;
  Vector<float> u;
  PositiveDefiniteSolver<float> solver;
  size_t N;
  Vector<float> *x;
  MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff38;
  RhsNested in_stack_ffffffffffffff40;
  PositiveDefiniteSolver<float> *this;
  LhsNested in_stack_ffffffffffffff48;
  Vector<float> *size;
  Vector<float> *rhs;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  PositiveDefiniteSolver<float> *in_stack_ffffffffffffff90;
  SparseMatrix<float> *in_stack_ffffffffffffff98;
  PositiveDefiniteSolver<float> *in_stack_ffffffffffffffa0;
  
  size = in_RDI;
  Eigen::SparseMatrix<float,_0,_int>::rows(in_RDX);
  PositiveDefiniteSolver<float>::PositiveDefiniteSolver
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Random((Index)size);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            (in_stack_ffffffffffffff40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)in_stack_ffffffffffffff38);
  in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 & 0xffffff;
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix
            (in_stack_ffffffffffffff40,(Matrix<float,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff38);
  PVar1.m_rhs = in_stack_ffffffffffffff40;
  PVar1.m_lhs = in_stack_ffffffffffffff48;
  for (rhs = (Vector<float> *)0x0; this = (PositiveDefiniteSolver<float> *)PVar1.m_rhs, rhs < in_RCX
      ; rhs = (Vector<float> *)
              ((long)&(rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data + 1)) {
    PVar1 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                      ((SparseMatrixBase<Eigen::SparseMatrix<float,_0,_int>_> *)this,
                       in_stack_ffffffffffffff38);
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
              (PVar1.m_rhs,
               (EigenBase<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
                *)in_stack_ffffffffffffff38);
    PositiveDefiniteSolver<float>::solve
              (in_stack_ffffffffffffff90,
               (Vector<float> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),rhs);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x28fdeb);
    anon_unknown_1::normalize<float>(in_RDI,PVar1.m_lhs);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
              (PVar1.m_rhs,(Matrix<float,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff38);
  }
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x28fe92);
  PositiveDefiniteSolver<float>::~PositiveDefiniteSolver(this);
  VVar2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)size;
  return (Vector<float>)
         VVar2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector<T> largestEigenvector(SparseMatrix<T>& energyMatrix, SparseMatrix<T>& massMatrix, size_t nIterations) {

  size_t N = massMatrix.rows();
  PositiveDefiniteSolver<T> solver(massMatrix);

  Vector<T> u = Vector<T>::Random(N);
  Vector<T> x = u;
  for (size_t iIter = 0; iIter < nIterations; iIter++) {
    solver.solve(x, energyMatrix * u);
    normalize(x, massMatrix);
    u = x;
  }

  return x;
}